

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# core-as.c
# Opt level: O2

int setrbf(match *res,rbitfield *bf,easm_expr *expr)

{
  int iVar1;
  long lVar2;
  ull uVar3;
  uint uVar4;
  ulong uVar5;
  
  iVar1 = easm_isimm(expr);
  if (iVar1 == 0) {
    uVar4 = 0;
  }
  else if ((expr->type == EASM_EXPR_NUM) && (bf->pcrel == 0)) {
    uVar5 = expr->num - bf->addend >> ((byte)bf->shr & 0x3f);
    setsbf(res,bf->sbf[0].pos,bf->sbf[0].len,uVar5);
    setsbf(res,bf->sbf[1].pos,bf->sbf[1].len,uVar5 >> ((byte)bf->sbf[0].len & 0x3f));
    uVar4 = bf->sbf[0].len + bf->shr + bf->sbf[1].len;
    uVar5 = ~(-1L << ((byte)uVar4 & 0x3f));
    if (0x3f < uVar4) {
      uVar5 = 0xffffffffffffffff;
    }
    iVar1 = bf->wrapok;
    uVar3 = getrbf_as(bf,res->a,res->m,0);
    uVar4 = (uint)(((uVar3 ^ expr->num) & (-(ulong)(iVar1 == 0) | uVar5)) == 0);
  }
  else {
    iVar1 = res->nrelocs;
    lVar2 = (long)iVar1;
    if (lVar2 == 8) {
      __assert_fail("res->nrelocs != 8",
                    "/workspace/llm4binary/github/license_c_cmakelists/envytools[P]envytools/envydis/core-as.c"
                    ,0xc4,"int setrbf(struct match *, const struct rbitfield *, struct easm_expr *)"
                   );
    }
    res->relocs[lVar2].bf = bf;
    res->relocs[lVar2].expr = expr;
    res->nrelocs = iVar1 + 1;
    uVar4 = 1;
  }
  return uVar4;
}

Assistant:

static int setrbf (struct match *res, const struct rbitfield *bf, struct easm_expr *expr) {
	if (!easm_isimm(expr))
		return 0;
	if (expr->type != EASM_EXPR_NUM || bf->pcrel) {
		assert (res->nrelocs != 8);
		res->relocs[res->nrelocs].bf = bf;
		res->relocs[res->nrelocs].expr = expr;
		res->nrelocs++;
		return 1;
	}
	ull num = expr->num - bf->addend;
	num >>= bf->shr;
	setsbf(res, bf->sbf[0].pos, bf->sbf[0].len, num);
	num >>= bf->sbf[0].len;
	setsbf(res, bf->sbf[1].pos, bf->sbf[1].len, num);
	ull mask = ~0ull;
	ull totalsz = bf->shr + bf->sbf[0].len + bf->sbf[1].len;
	if (bf->wrapok && totalsz < 64)
		mask = (1ull << totalsz) - 1;
	return (getrbf_as(bf, res->a, res->m, 0) & mask) == (expr->num & mask);
}